

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O2

void __thiscall CNetBan::Update(CNetBan *this)

{
  int iVar1;
  CBan<NETADDR> *pData;
  CBan<CNetRange> *pData_00;
  int iVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  char aNetStr [256];
  char aBuf [256];
  char acStack_238 [256];
  char local_138 [256];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = time_timestamp();
  while (((pData = (this->m_BanAddrPool).m_pFirstUsed, pData != (CBan<NETADDR> *)0x0 &&
          (iVar1 = (pData->m_Info).m_Expires, iVar1 != -1)) && (iVar1 < iVar2))) {
    pcVar3 = NetToString(this,&pData->m_Data,acStack_238,0x100);
    str_format(local_138,0x100,"ban %s expired",pcVar3);
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,0,"net_ban",local_138);
    CBanPool<NETADDR,_1>::Remove(&this->m_BanAddrPool,(this->m_BanAddrPool).m_pFirstUsed);
  }
  while (((pData_00 = (this->m_BanRangePool).m_pFirstUsed, pData_00 != (CBan<CNetRange> *)0x0 &&
          (iVar1 = (pData_00->m_Info).m_Expires, iVar1 != -1)) && (iVar1 < iVar2))) {
    pcVar3 = NetToString(this,&pData_00->m_Data,acStack_238,0x100);
    str_format(local_138,0x100,"ban %s expired",pcVar3);
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,0,"net_ban",local_138,0);
    CBanPool<CNetRange,_16>::Remove(&this->m_BanRangePool,(this->m_BanRangePool).m_pFirstUsed);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNetBan::Update()
{
	int Now = time_timestamp();

	// remove expired bans
	char aBuf[256], aNetStr[256];
	while(m_BanAddrPool.First() && m_BanAddrPool.First()->m_Info.m_Expires != CBanInfo::EXPIRES_NEVER && m_BanAddrPool.First()->m_Info.m_Expires < Now)
	{
		str_format(aBuf, sizeof(aBuf), "ban %s expired", NetToString(&m_BanAddrPool.First()->m_Data, aNetStr, sizeof(aNetStr)));
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aBuf);
		m_BanAddrPool.Remove(m_BanAddrPool.First());
	}
	while(m_BanRangePool.First() && m_BanRangePool.First()->m_Info.m_Expires != CBanInfo::EXPIRES_NEVER && m_BanRangePool.First()->m_Info.m_Expires < Now)
	{
		str_format(aBuf, sizeof(aBuf), "ban %s expired", NetToString(&m_BanRangePool.First()->m_Data, aNetStr, sizeof(aNetStr)));
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aBuf);
		m_BanRangePool.Remove(m_BanRangePool.First());
	}
}